

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase287::run(TestCase287 *this)

{
  Reader reader_00;
  Builder builder_00;
  word *pwVar1;
  size_t sVar2;
  size_t in_RCX;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Array<capnp::word> serialized;
  TestInputStream stream;
  InputStreamMessageReader reader;
  TestMessageBuilder builder;
  Array<capnp::word> local_308;
  PointerReader local_2e8;
  StructBuilder local_2c0;
  InputStream local_298;
  word *local_290;
  word *local_288;
  undefined1 local_280;
  Reader local_278;
  StructReader local_258;
  SegmentBuilder *local_228;
  undefined1 in_stack_fffffffffffffdf0 [24];
  TestMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_0036cab8;
  local_100.desiredSegmentCount = 10;
  MessageBuilder::getRootInternal((Builder *)&local_2e8,(MessageBuilder *)&local_100);
  local_228 = (SegmentBuilder *)local_2e8.segment;
  PointerBuilder::initStruct(&local_2c0,(PointerBuilder *)&local_228,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)local_2e8.pointer;
  builder_00._builder.segment = (SegmentBuilder *)local_2e8.capTable;
  builder_00._builder.data = (void *)in_stack_fffffffffffffdf0._0_8_;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffdf0._8_8_;
  builder_00._builder.dataSize = in_stack_fffffffffffffdf0._16_4_;
  builder_00._builder.pointerCount = in_stack_fffffffffffffdf0._20_2_;
  builder_00._builder._38_2_ = in_stack_fffffffffffffdf0._22_2_;
  initTestMessage(builder_00);
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar3.size_;
  segments.size_ = in_RCX;
  messageToFlatArray(&local_308,(capnp *)AVar3.ptr,segments);
  local_298._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_0036cb88;
  local_290 = local_308.ptr;
  local_288 = local_308.ptr + local_308.size_;
  local_280 = 0;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  InputStreamMessageReader::InputStreamMessageReader
            ((InputStreamMessageReader *)&local_228,&local_298,options,
             (ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal(&local_278,(MessageReader *)&local_228);
  local_2e8.pointer = local_278.reader.pointer;
  local_2e8.nestingLimit = local_278.reader.nestingLimit;
  local_2e8._28_4_ = local_278.reader._28_4_;
  local_2e8.segment = local_278.reader.segment;
  local_2e8.capTable = local_278.reader.capTable;
  PointerReader::getStruct(&local_258,&local_2e8,(word *)0x0);
  reader_00._reader.capTable = local_258.capTable;
  reader_00._reader.segment = local_258.segment;
  reader_00._reader.data = local_258.data;
  reader_00._reader.pointers = local_258.pointers;
  reader_00._reader.dataSize = local_258.dataSize;
  reader_00._reader.pointerCount = local_258.pointerCount;
  reader_00._reader._38_2_ = local_258._38_2_;
  reader_00._reader.nestingLimit = local_258.nestingLimit;
  reader_00._reader._44_4_ = local_258._44_4_;
  checkTestMessage(reader_00);
  InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)&local_228);
  kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&local_298);
  sVar2 = local_308.size_;
  pwVar1 = local_308.ptr;
  if (local_308.ptr != (word *)0x0) {
    local_308.ptr = (word *)0x0;
    local_308.size_ = 0;
    (*(code *)**(undefined8 **)local_308.disposer)(local_308.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Orphans, ZeroOut) {
  MallocMessageBuilder builder;
  TestAllTypes::Reader orphanReader;

  {
    Orphan<TestAllTypes> orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    orphanReader = orphan.getReader();
    initTestMessage(orphan.get());
    checkTestMessage(orphan.getReader());
  }

  // Once the Orphan destructor is called, the message should be zero'd out.
  checkTestMessageAllZero(orphanReader);
}